

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.h
# Opt level: O2

Path * __thiscall Path::ensureTrailingSlash(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  String SStack_38;
  
  if (((this->super_String).mString._M_string_length != 0) &&
     (bVar1 = String::endsWith(&this->super_String,'/',CaseSensitive), !bVar1)) {
    operator+(&SStack_38,&this->super_String,'/');
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&SStack_38);
    std::__cxx11::string::~string((string *)&SStack_38);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

inline Path ensureTrailingSlash() const
    {
        if (!isEmpty() && !endsWith('/'))
            return *this + '/';
        return *this;
    }